

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorykeyvaluestore.cpp
# Opt level: O1

Set __thiscall
groundupdbext::MemoryKeyValueStore::getKeyValueSet(MemoryKeyValueStore *this,HashedValue *key)

{
  _Hashtable<groundupdb::EncodedValue,_groundupdb::EncodedValue,_std::allocator<groundupdb::EncodedValue>,_std::__detail::_Identity,_std::equal_to<groundupdb::EncodedValue>,_std::hash<groundupdb::EncodedValue>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *__ht;
  size_t sVar1;
  iterator iVar2;
  _Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *this_00;
  _func_int **pp_Var3;
  key_type *in_RDX;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<groundupdb::EncodedValue,_true>_>_> local_20;
  
  iVar2 = std::
          _Hashtable<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_std::allocator<std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<groundupdb::HashedValue,_std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_std::allocator<std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<groundupdb::HashedValue>,_groundupdbext::HighwayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(*(long *)&key->m_has_value + 0x80),in_RDX);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    if (*(char *)(*(long *)&key->m_has_value + 0x108) == '\x01') {
      (**(code **)(**(long **)(*(long *)&key->m_has_value + 0x100) + 0x28))(this);
    }
    else {
      pp_Var3 = (_func_int **)operator_new(0x38);
      *pp_Var3 = (_func_int *)0x0;
      pp_Var3[1] = (_func_int *)0x0;
      pp_Var3[4] = (_func_int *)0x0;
      pp_Var3[5] = (_func_int *)0x0;
      pp_Var3[2] = (_func_int *)0x0;
      pp_Var3[3] = (_func_int *)0x0;
      pp_Var3[6] = (_func_int *)0x0;
      *pp_Var3 = (_func_int *)(pp_Var3 + 6);
      pp_Var3[1] = (_func_int *)0x1;
      *(undefined4 *)(pp_Var3 + 4) = 0x3f800000;
      pp_Var3[5] = (_func_int *)0x0;
      pp_Var3[6] = (_func_int *)0x0;
      (this->super_KeyValueStore).super_Store._vptr_Store = pp_Var3;
    }
  }
  else {
    __ht = *(_Hashtable<groundupdb::EncodedValue,_groundupdb::EncodedValue,_std::allocator<groundupdb::EncodedValue>,_std::__detail::_Identity,_std::equal_to<groundupdb::EncodedValue>,_std::hash<groundupdb::EncodedValue>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             **)((long)iVar2.
                       super__Node_iterator_base<std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_false>
                       ._M_cur + 0x40);
    this_00 = (_Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               *)operator_new(0x38);
    *(undefined8 *)this_00 = 0;
    *(size_type *)(this_00 + 8) = __ht->_M_bucket_count;
    *(undefined8 *)(this_00 + 0x10) = 0;
    *(size_type *)(this_00 + 0x18) = __ht->_M_element_count;
    sVar1 = (__ht->_M_rehash_policy)._M_next_resize;
    *(undefined8 *)(this_00 + 0x20) = *(undefined8 *)&__ht->_M_rehash_policy;
    *(size_t *)(this_00 + 0x28) = sVar1;
    *(undefined8 *)(this_00 + 0x30) = 0;
    local_20._M_h = (__hashtable_alloc *)this_00;
    std::
    _Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign<std::_Hashtable<groundupdb::EncodedValue,groundupdb::EncodedValue,std::allocator<groundupdb::EncodedValue>,std::__detail::_Identity,std::equal_to<groundupdb::EncodedValue>,std::hash<groundupdb::EncodedValue>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<groundupdb::EncodedValue,true>>>>
              (this_00,__ht,&local_20);
    (this->super_KeyValueStore).super_Store._vptr_Store = (_func_int **)this_00;
  }
  return (__uniq_ptr_data<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>,_true,_true>
          )(__uniq_ptr_data<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>,_true,_true>
            )this;
}

Assistant:

Set
MemoryKeyValueStore::getKeyValueSet(const HashedValue& key) {
  const auto& v = mImpl->m_listStore.find(key);
  //std::cout << "MEMKVS: getKeyValueSet" << std::endl;
  if (v == mImpl->m_listStore.end()) {
    //std::cout << "  MEMKVS: not found in memory" << std::endl;
    // try underlying store first
    if (mImpl->m_cachedStore) {
      //std::cout << "  MEMKVS: checking underlying store we're caching for and returning" << std::endl;
      return mImpl->m_cachedStore->get()->getKeyValueSet(key);
    }
    //std::cout << "  MEMKVS: Returning empty value" << std::endl;
    return std::make_unique<std::unordered_set<EncodedValue>>(); // copy ctor
  }
  //std::cout << "  MEMKVS: returning Set with size: " << v->second->size() << std::endl;
  // Note we dereference the below because v->second is an unorderedmap hashedvalue wrapper, and not the Set value itself
  return std::make_unique<std::unordered_set<EncodedValue>>(*(v->second)); // copy ctor
}